

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGBToRGB24Row_C(uint8_t *src_argb,uint8_t *dst_rgb,int width)

{
  uint8_t uVar1;
  long lVar2;
  
  if (0 < width) {
    lVar2 = 0;
    do {
      uVar1 = src_argb[lVar2 * 4 + 2];
      *(undefined2 *)dst_rgb = *(undefined2 *)(src_argb + lVar2 * 4);
      dst_rgb[2] = uVar1;
      lVar2 = lVar2 + 1;
      dst_rgb = dst_rgb + 3;
    } while (width != (int)lVar2);
  }
  return;
}

Assistant:

void ARGBToRGB24Row_C(const uint8_t* src_argb, uint8_t* dst_rgb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb[0];
    uint8_t g = src_argb[1];
    uint8_t r = src_argb[2];
    dst_rgb[0] = b;
    dst_rgb[1] = g;
    dst_rgb[2] = r;
    dst_rgb += 3;
    src_argb += 4;
  }
}